

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O0

void __thiscall DIS::VariableDatum::unmarshal(VariableDatum *this,DataStream *dataStream)

{
  char acVar1 [8];
  undefined1 local_30 [8];
  EightByteChunk x;
  size_t idx;
  DataStream *dataStream_local;
  VariableDatum *this_local;
  
  DataStream::operator>>(dataStream,&this->_variableDatumID);
  DataStream::operator>>(dataStream,&this->_variableDatumLength);
  this->_variableDatumLength =
       (this->_variableDatumLength >> 6) + (uint)((this->_variableDatumLength & 0x3f) != 0);
  std::vector<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>::clear
            (&this->_variableDatums);
  x._otherParameters[0] = '\0';
  x._otherParameters[1] = '\0';
  x._otherParameters[2] = '\0';
  x._otherParameters[3] = '\0';
  x._otherParameters[4] = '\0';
  x._otherParameters[5] = '\0';
  x._otherParameters[6] = '\0';
  x._otherParameters[7] = '\0';
  for (; acVar1[4] = '\0', acVar1[5] = '\0', acVar1[6] = '\0', acVar1[7] = '\0',
      acVar1._0_4_ = this->_variableDatumLength, (ulong)x._otherParameters < (ulong)acVar1;
      x._otherParameters = (char  [8])((long)x._otherParameters + 1)) {
    EightByteChunk::EightByteChunk((EightByteChunk *)local_30);
    EightByteChunk::unmarshal((EightByteChunk *)local_30,dataStream);
    std::vector<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>::push_back
              (&this->_variableDatums,(value_type *)local_30);
    EightByteChunk::~EightByteChunk((EightByteChunk *)local_30);
  }
  return;
}

Assistant:

void VariableDatum::unmarshal(DataStream& dataStream)
{
    dataStream >> _variableDatumID;
    dataStream >> _variableDatumLength;
    _variableDatumLength = (_variableDatumLength / 64) + ((_variableDatumLength % 64) > 0);

     _variableDatums.clear();
     for(size_t idx = 0; idx < _variableDatumLength; idx++)
     {
        EightByteChunk x;
        x.unmarshal(dataStream);
        _variableDatums.push_back(x);
     }
}